

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O3

void secp256k1_fe_from_signed62(secp256k1_fe *r,secp256k1_modinv64_signed62 *a)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = a->v[0];
  if (uVar2 >> 0x3e == 0) {
    uVar3 = a->v[1];
    if (0x3fffffffffffffff < uVar3) goto LAB_001456c9;
    uVar4 = a->v[2];
    if (0x3fffffffffffffff < uVar4) goto LAB_001456ce;
    uVar5 = a->v[3];
    if (uVar5 < 0x4000000000000000) {
      uVar6 = a->v[4];
      if (uVar6 < 0x100) {
        r->n[0] = uVar2 & 0xfffffffffffff;
        r->n[1] = (uVar3 & 0x3ffffffffff) << 10 | uVar2 >> 0x34;
        r->n[2] = (uVar4 & 0xffffffff) << 0x14 | uVar3 >> 0x2a;
        r->n[3] = (ulong)((uint)uVar5 & 0x3fffff) << 0x1e | uVar4 >> 0x20;
        r->n[4] = uVar6 << 0x28 | uVar5 >> 0x16;
        return;
      }
      goto LAB_001456d8;
    }
  }
  else {
    secp256k1_fe_from_signed62_cold_5();
LAB_001456c9:
    secp256k1_fe_from_signed62_cold_4();
LAB_001456ce:
    secp256k1_fe_from_signed62_cold_3();
  }
  secp256k1_fe_from_signed62_cold_2();
LAB_001456d8:
  secp256k1_fe_from_signed62_cold_1();
  uVar1 = *(uint *)((long)a->v + 0x1c);
  r->n[0] = (ulong)(*(byte *)((long)a->v + 0x19) & 0xf) << 0x30 |
            (ulong)CONCAT15(*(undefined1 *)((long)a->v + 0x1a),
                            CONCAT14(*(undefined1 *)((long)a->v + 0x1b),
                                     uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8
                                     | uVar1 << 0x18));
  r->n[1] = (ulong)*(byte *)((long)a->v + 0x13) << 0x2c |
            (ulong)*(byte *)((long)a->v + 0x14) << 0x24 |
            (ulong)*(byte *)((long)a->v + 0x15) << 0x1c |
            (ulong)((uint)*(byte *)((long)a->v + 0x16) << 0x14 |
                   (uint)*(byte *)((long)a->v + 0x17) << 0xc |
                   (uint)(byte)a->v[3] << 4 | (uint)(*(byte *)((long)a->v + 0x19) >> 4));
  uVar1 = *(uint *)((long)a->v + 0xf);
  r->n[2] = (ulong)(*(byte *)((long)a->v + 0xc) & 0xf) << 0x30 |
            (ulong)CONCAT15(*(undefined1 *)((long)a->v + 0xd),
                            CONCAT14(*(undefined1 *)((long)a->v + 0xe),
                                     uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8
                                     | uVar1 << 0x18));
  r->n[3] = (ulong)*(byte *)((long)a->v + 6) << 0x2c |
            (ulong)*(byte *)((long)a->v + 7) << 0x24 |
            (ulong)(byte)a->v[1] << 0x1c |
            (ulong)((uint)*(byte *)((long)a->v + 9) << 0x14 |
                   (uint)*(byte *)((long)a->v + 10) << 0xc |
                   (uint)*(byte *)((long)a->v + 0xb) << 4 | (uint)(*(byte *)((long)a->v + 0xc) >> 4)
                   );
  uVar1 = *(uint *)((long)a->v + 2);
  r->n[4] = (ulong)CONCAT15((char)a->v[0],
                            CONCAT14(*(undefined1 *)((long)a->v + 1),
                                     uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8
                                     | uVar1 << 0x18));
  return;
}

Assistant:

static void secp256k1_fe_from_signed62(secp256k1_fe *r, const secp256k1_modinv64_signed62 *a) {
    const uint64_t M52 = UINT64_MAX >> 12;
    const uint64_t a0 = a->v[0], a1 = a->v[1], a2 = a->v[2], a3 = a->v[3], a4 = a->v[4];

    /* The output from secp256k1_modinv64{_var} should be normalized to range [0,modulus), and
     * have limbs in [0,2^62). The modulus is < 2^256, so the top limb must be below 2^(256-62*4).
     */
    VERIFY_CHECK(a0 >> 62 == 0);
    VERIFY_CHECK(a1 >> 62 == 0);
    VERIFY_CHECK(a2 >> 62 == 0);
    VERIFY_CHECK(a3 >> 62 == 0);
    VERIFY_CHECK(a4 >> 8 == 0);

    r->n[0] =  a0                   & M52;
    r->n[1] = (a0 >> 52 | a1 << 10) & M52;
    r->n[2] = (a1 >> 42 | a2 << 20) & M52;
    r->n[3] = (a2 >> 32 | a3 << 30) & M52;
    r->n[4] = (a3 >> 22 | a4 << 40);
}